

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfBoxAttribute.cpp
# Opt level: O2

void __thiscall
Imf_2_5::TypedAttribute<Imath_2_5::Box<Imath_2_5::Vec2<int>_>_>::readValueFrom
          (TypedAttribute<Imath_2_5::Box<Imath_2_5::Vec2<int>_>_> *this,IStream *is,int size,
          int version)

{
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(is,(int *)&this->_value);
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(is,&(this->_value).min.y);
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(is,&(this->_value).max.x);
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(is,&(this->_value).max.y);
  return;
}

Assistant:

void
Box2iAttribute::readValueFrom (OPENEXR_IMF_INTERNAL_NAMESPACE::IStream &is, int size, int version)
{
    Xdr::read <StreamIO> (is, _value.min.x);
    Xdr::read <StreamIO> (is, _value.min.y);
    Xdr::read <StreamIO> (is, _value.max.x);
    Xdr::read <StreamIO> (is, _value.max.y);
}